

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall CConfigManager::Save(CConfigManager *this,char *pFilename)

{
  char *pcVar1;
  long lVar2;
  IStorage *pIVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  long lVar6;
  char *pcVar7;
  void **ppvVar8;
  long in_FS_OFFSET;
  char aBuf [256];
  char aEscapeBuf [2048];
  char aLineBuf [2048];
  
  aEscapeBuf[8] = '\0';
  aEscapeBuf[9] = '\0';
  aEscapeBuf[10] = '\0';
  aEscapeBuf[0xb] = '\0';
  aEscapeBuf[0xc] = '\0';
  aEscapeBuf[0xd] = '\0';
  aEscapeBuf[0xe] = '\0';
  aEscapeBuf[0xf] = '\0';
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar3 = this->m_pStorage;
  if (pIVar3 == (IStorage *)0x0) goto LAB_00123587;
  pcVar7 = "settings07.cfg";
  if (pFilename != (char *)0x0) {
    pcVar7 = pFilename;
  }
  iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,pcVar7,2,0,0,0,0,0);
  this->m_ConfigFile = (IOHANDLE)CONCAT44(extraout_var,iVar4);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar4) == (IOHANDLE)0x0) goto LAB_00123587;
  (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,"# Teeworlds 0.7.5");
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_ClPredict != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_predict");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClPredictPlayers != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_predict_players");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClPredictProjectiles != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_predict_projectiles");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClNameplates != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_nameplates");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClNameplatesAlways != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_nameplates_always");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClNameplatesTeamcolors != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_nameplates_teamcolors");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClNameplatesSize != 0x32) {
      str_format(aLineBuf,0x800,"%s %i","cl_nameplates_size");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClAutoswitchWeapons != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_autoswitch_weapons");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowhud != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_showhud");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowChat != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_showchat");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClFilterchat != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_filterchat");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClDisableWhisper != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_disable_whisper");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowsocial != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_showsocial");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowfps != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_showfps");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClAirjumpindicator != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_airjumpindicator");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClWarningTeambalance != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_warning_teambalance");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClDynamicCamera != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_dynamic_camera");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClMouseDeadzone != 300) {
      str_format(aLineBuf,0x800,"%s %i","cl_mouse_deadzone");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClMouseFollowfactor != 0x3c) {
      str_format(aLineBuf,0x800,"%s %i","cl_mouse_followfactor");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClMouseMaxDistanceDynamic != 1000) {
      str_format(aLineBuf,0x800,"%s %i","cl_mouse_max_distance_dynamic");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClMouseMaxDistanceStatic != 400) {
      str_format(aLineBuf,0x800,"%s %i","cl_mouse_max_distance_static");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClCameraSmoothness != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_camera_smoothness");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClCameraStabilizing != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_camera_stabilizing");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClCustomizeSkin != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_customize_skin");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowUserId != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_user_id");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdZoomTarget != 1) {
      str_format(aLineBuf,0x800,"%s %i","ed_zoom_target");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdShowkeys != 0) {
      str_format(aLineBuf,0x800,"%s %i","ed_showkeys");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorGridInner != -0xda) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_grid_inner");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorGridOuter != -0xb3b3b4) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_grid_outer");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPoint != -0xffff01) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPointHover != -1) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point_hover");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPointActive != -1) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_point_active");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPivot != 0xff00ff) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPivotHover != -1) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot_hover");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorQuadPivotActive != -1) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_quad_pivot_active");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorSelectionQuad != -1) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_selection_quad");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_EdColorSelectionTile != -0x9a) {
      str_format(aLineBuf,0x800,"%s %i","ed_color_selection_tile");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowWelcome != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_welcome");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClMotdTime != 10) {
      str_format(aLineBuf,0x800,"%s %i","cl_motd_time");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowXmasHats != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_xmas_hats");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    if ((this->m_Values).m_ClShowEasterEggs != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_easter_eggs");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_001205f2;
    }
    pcVar1 = (this->m_Values).m_ClVersionServer;
    iVar4 = str_comp(pcVar1,"version.teeworlds.com");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_version_server",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001205f2:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_ClLanguagefile;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_languagefile",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_PlayerColorBody != 0x1b6f74) {
      str_format(aLineBuf,0x800,"%s %i","player_color_body");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerColorMarking != -0xffff01) {
      str_format(aLineBuf,0x800,"%s %i","player_color_marking");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerColorDecoration != 0x1b6f74) {
      str_format(aLineBuf,0x800,"%s %i","player_color_decoration");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerColorHands != 0x1b759e) {
      str_format(aLineBuf,0x800,"%s %i","player_color_hands");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerColorFeet != 0x1c873e) {
      str_format(aLineBuf,0x800,"%s %i","player_color_feet");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerColorEyes != 0xff) {
      str_format(aLineBuf,0x800,"%s %i","player_color_eyes");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorBody != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_body");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorMarking != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_marking");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorDecoration != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_decoration");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorHands != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_hands");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorFeet != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_feet");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    if ((this->m_Values).m_PlayerUseCustomColorEyes != 1) {
      str_format(aLineBuf,0x800,"%s %i","player_use_custom_color_eyes");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120a3c;
    }
    pcVar1 = (this->m_Values).m_PlayerSkin;
    iVar4 = str_comp(pcVar1,"default");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00120a3c:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinBody;
    iVar4 = str_comp(pcVar1,"standard");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_body",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinMarking;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_marking",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinDecoration;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_decoration",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinHands;
    iVar4 = str_comp(pcVar1,"standard");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_hands",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinFeet;
    iVar4 = str_comp(pcVar1,"standard");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_feet",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerSkinEyes;
    iVar4 = str_comp(pcVar1,"standard");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_skin_eyes",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_UiBrowserPage != 5) {
      str_format(aLineBuf,0x800,"%s %i","ui_browser_page");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120dbf;
    }
    if ((this->m_Values).m_UiSettingsPage != 0) {
      str_format(aLineBuf,0x800,"%s %i","ui_settings_page");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120dbf;
    }
    pcVar1 = (this->m_Values).m_UiServerAddress;
    iVar4 = str_comp(pcVar1,"localhost:8303");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00120dbf:
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_UiServerAddressLan;
    iVar4 = str_comp(pcVar1,"localhost:8303");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","ui_server_address_lan",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_UiMousesens != 100) {
      str_format(aLineBuf,0x800,"%s %i","ui_mousesens");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120ffd;
    }
    if ((this->m_Values).m_UiJoystickSens != 100) {
      str_format(aLineBuf,0x800,"%s %i","ui_joystick_sens");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120ffd;
    }
    if ((this->m_Values).m_UiAutoswitchInfotab != 1) {
      str_format(aLineBuf,0x800,"%s %i","ui_autoswitch_infotab");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120ffd;
    }
    if ((this->m_Values).m_UiWideview != 0) {
      str_format(aLineBuf,0x800,"%s %i","ui_wideview");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120ffd;
    }
    if ((this->m_Values).m_GfxNoclip != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_noclip");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00120ffd;
    }
    pcVar1 = (this->m_Values).m_ClMenuMap;
    iVar4 = str_comp(pcVar1,"auto");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","cl_menu_map",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00120ffd:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_ClShowMenuMap != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_menu_map");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClMenuAlpha != 0x19) {
      str_format(aLineBuf,0x800,"%s %i","cl_menu_alpha");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClRotationRadius != 0x1e) {
      str_format(aLineBuf,0x800,"%s %i","cl_rotation_radius");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClRotationSpeed != 0x28) {
      str_format(aLineBuf,0x800,"%s %i","cl_rotation_speed");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClCameraSpeed != 5) {
      str_format(aLineBuf,0x800,"%s %i","cl_camera_speed");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClShowStartMenuImages != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_start_menu_images");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClSkipStartMenu != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_skip_start_menu");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClHideSelfScore != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_hide_self_score");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClStatboardInfos != 0x4eb) {
      str_format(aLineBuf,0x800,"%s %i","cl_statboard_infos");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClShowLocalTimeAlways != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_local_time_always");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00121322;
    }
    if ((this->m_Values).m_ClLastVersionPlayed != 0x704) {
      str_format(aLineBuf,0x800,"%s %i","cl_last_version_played");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00121322:
  if ((uVar5 & 5) != 0) {
    if ((this->m_Values).m_SvWarmup != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_warmup");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_0012141a;
    }
    if ((this->m_Values).m_SvCountdown != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_countdown");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_0012141a;
    }
    pcVar1 = (this->m_Values).m_SvMotd;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_motd",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_0012141a:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvTeamdamage != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_teamdamage");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001214cd;
    }
    pcVar1 = (this->m_Values).m_SvMaprotation;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_maprotation",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001214cd:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvMatchesPerMap != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_matches_per_map");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001216a0;
    }
    if ((this->m_Values).m_SvMatchSwap != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_match_swap");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001216a0;
    }
    if ((this->m_Values).m_SvPowerups != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_powerups");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001216a0;
    }
    if ((this->m_Values).m_SvScorelimit != 0x14) {
      str_format(aLineBuf,0x800,"%s %i","sv_scorelimit");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001216a0;
    }
    if ((this->m_Values).m_SvTimelimit != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_timelimit");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001216a0;
    }
    pcVar1 = (this->m_Values).m_SvGametype;
    iVar4 = str_comp(pcVar1,"dm");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_gametype",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001216a0:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 5) != 0) {
    if ((this->m_Values).m_SvTournamentMode != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_tournament_mode");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvPlayerReadyMode != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_player_ready_mode");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvSpamprotection != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_spamprotection");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvRespawnDelayTDM != 3) {
      str_format(aLineBuf,0x800,"%s %i","sv_respawn_delay_tdm");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvPlayerSlots != 8) {
      str_format(aLineBuf,0x800,"%s %i","sv_player_slots");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvSkillLevel != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_skill_level");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvTeambalanceTime != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_teambalance_time");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvInactiveKickTime != 3) {
      str_format(aLineBuf,0x800,"%s %i","sv_inactivekick_time");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvInactiveKick != 2) {
      str_format(aLineBuf,0x800,"%s %i","sv_inactivekick");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvInactiveKickSpec != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_inactivekick_spec");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvSilentSpectatorMode != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_silent_spectator_mode");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvStrictSpectateMode != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_strict_spectate_mode");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvVoteSpectate != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_vote_spectate");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvVoteSpectateRejoindelay != 3) {
      str_format(aLineBuf,0x800,"%s %i","sv_vote_spectate_rejoindelay");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvVoteKick != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_vote_kick");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvVoteKickMin != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_vote_kick_min");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 5) == 0) goto LAB_00121b73;
    }
    if ((this->m_Values).m_SvVoteKickBantime != 5) {
      str_format(aLineBuf,0x800,"%s %i","sv_vote_kick_bantime");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00121b73:
  if ((uVar5 & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerName;
    iVar4 = str_comp(pcVar1,"nameless tee");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_name",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 3) != 0) {
    pcVar1 = (this->m_Values).m_PlayerClan;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","player_clan",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  uVar5 = this->m_FlagMask;
  if (((uVar5 & 3) != 0) && ((this->m_Values).m_PlayerCountry != -1)) {
    str_format(aLineBuf,0x800,"%s %i","player_country");
    (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    uVar5 = this->m_FlagMask;
  }
  if ((uVar5 & 7) != 0) {
    pcVar1 = (this->m_Values).m_Password;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 7) != 0) {
    pcVar1 = (this->m_Values).m_Logfile;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","logfile",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 7) != 0) {
    if ((this->m_Values).m_LogfileTimestamp != 0) {
      str_format(aLineBuf,0x800,"%s %i","logfile_timestamp");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 7) == 0) goto LAB_00121df6;
    }
    if ((this->m_Values).m_ConsoleOutputLevel != 0) {
      str_format(aLineBuf,0x800,"%s %i","console_output_level");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00121df6:
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_ShowConsoleWindow != 1) {
      str_format(aLineBuf,0x800,"%s %i","show_console_window");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClCpuThrottle != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_cpu_throttle");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClLoadCountryFlags != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_load_country_flags");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClAutoDemoRecord != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_auto_demo_record");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClAutoDemoMax != 10) {
      str_format(aLineBuf,0x800,"%s %i","cl_auto_demo_max");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClAutoScreenshot != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_auto_screenshot");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClAutoStatScreenshot != 0) {
      str_format(aLineBuf,0x800,"%s %i","cl_auto_statscreenshot");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClAutoScreenshotMax != 10) {
      str_format(aLineBuf,0x800,"%s %i","cl_auto_screenshot_max");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClShowServerBroadcast != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_show_server_broadcast");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClColoredBroadcast != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_colored_broadcast");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    if ((this->m_Values).m_ClSaveServerPasswords != 1) {
      str_format(aLineBuf,0x800,"%s %i","cl_save_server_passwords");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122174;
    }
    pcVar1 = (this->m_Values).m_BrFilterString;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","br_filter_string",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00122174:
  if ((this->m_FlagMask & 3) != 0) {
    if ((this->m_Values).m_BrSort != 4) {
      str_format(aLineBuf,0x800,"%s %i","br_sort");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_BrSortOrder != 1) {
      str_format(aLineBuf,0x800,"%s %i","br_sort_order");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_BrMaxRequests != 0x19) {
      str_format(aLineBuf,0x800,"%s %i","br_max_requests");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_BrDemoSort != 0) {
      str_format(aLineBuf,0x800,"%s %i","br_demo_sort");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_BrDemoSortOrder != 0) {
      str_format(aLineBuf,0x800,"%s %i","br_demo_sort_order");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndBufferSize != 0x200) {
      str_format(aLineBuf,0x800,"%s %i","snd_buffer_size");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndRate != 48000) {
      str_format(aLineBuf,0x800,"%s %i","snd_rate");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndEnable != 1) {
      str_format(aLineBuf,0x800,"%s %i","snd_enable");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndInit != 1) {
      str_format(aLineBuf,0x800,"%s %i","snd_init");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndMusic != 1) {
      str_format(aLineBuf,0x800,"%s %i","snd_enable_music");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndVolume != 100) {
      str_format(aLineBuf,0x800,"%s %i","snd_volume");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndNonactiveMute != 0) {
      str_format(aLineBuf,0x800,"%s %i","snd_nonactive_mute");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_SndAsyncLoading != 1) {
      str_format(aLineBuf,0x800,"%s %i","snd_async_loading");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxScreen != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_screen");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxScreenWidth != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_screen_width");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxScreenHeight != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_screen_height");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxBorderless != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_borderless");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxFullscreen != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_fullscreen");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxClear != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_clear");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxVsync != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_vsync");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxDisplayAllModes != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_display_all_modes");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxHighdpi != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_highdpi");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxTextureCompression != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_texture_compression");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxHighDetail != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_high_detail");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxTextureQuality != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_texture_quality");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxFsaaSamples != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_fsaa_samples");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxFinish != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_finish");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxAsyncRender != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_asyncrender");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxMaxFps != 0x90) {
      str_format(aLineBuf,0x800,"%s %i","gfx_maxfps");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxLimitFps != 0) {
      str_format(aLineBuf,0x800,"%s %i","gfx_limitfps");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_GfxUseX11XRandRWM != 1) {
      str_format(aLineBuf,0x800,"%s %i","gfx_use_x11xrandr_wm");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_InpGrab != 0) {
      str_format(aLineBuf,0x800,"%s %i","inp_grab");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_InpMousesens != 100) {
      str_format(aLineBuf,0x800,"%s %i","inp_mousesens");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    if ((this->m_Values).m_JoystickEnable != 0) {
      str_format(aLineBuf,0x800,"%s %i","joystick_enable");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 3) == 0) goto LAB_00122b6a;
    }
    pcVar1 = (this->m_Values).m_JoystickGUID;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","joystick_guid",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00122b6a:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 3) != 0) {
    if ((this->m_Values).m_JoystickAbsolute != 0) {
      str_format(aLineBuf,0x800,"%s %i","joystick_absolute");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00122cd4;
    }
    if ((this->m_Values).m_JoystickSens != 100) {
      str_format(aLineBuf,0x800,"%s %i","joystick_sens");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00122cd4;
    }
    if ((this->m_Values).m_JoystickX != 0) {
      str_format(aLineBuf,0x800,"%s %i","joystick_x");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00122cd4;
    }
    if ((this->m_Values).m_JoystickY != 1) {
      str_format(aLineBuf,0x800,"%s %i","joystick_y");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 3) == 0) goto LAB_00122cd4;
    }
    if ((this->m_Values).m_JoystickTolerance != 5) {
      str_format(aLineBuf,0x800,"%s %i","joystick_tolerance");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_00122cd4:
  if ((uVar5 & 5) != 0) {
    pcVar1 = (this->m_Values).m_SvName;
    iVar4 = str_comp(pcVar1,"unnamed server");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_name",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    pcVar1 = (this->m_Values).m_SvHostname;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_hostname",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 0x17) != 0) {
    pcVar1 = (this->m_Values).m_Bindaddr;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","bindaddr",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvPort != 0x206f) {
      str_format(aLineBuf,0x800,"%s %i","sv_port");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00122f14;
    }
    if ((this->m_Values).m_SvExternalPort != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_external_port");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_00122f14;
    }
    pcVar1 = (this->m_Values).m_SvMap;
    iVar4 = str_comp(pcVar1,"dm1");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_map",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_00122f14:
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvMaxClients != 8) {
      str_format(aLineBuf,0x800,"%s %i","sv_max_clients");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001230e7;
    }
    if ((this->m_Values).m_SvMaxClientsPerIP != 4) {
      str_format(aLineBuf,0x800,"%s %i","sv_max_clients_per_ip");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001230e7;
    }
    if ((this->m_Values).m_SvMapDownloadSpeed != 8) {
      str_format(aLineBuf,0x800,"%s %i","sv_map_download_speed");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001230e7;
    }
    if ((this->m_Values).m_SvHighBandwidth != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_high_bandwidth");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001230e7;
    }
    if ((this->m_Values).m_SvRegister != 1) {
      str_format(aLineBuf,0x800,"%s %i","sv_register");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001230e7;
    }
    pcVar1 = (this->m_Values).m_SvRconPassword;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001230e7:
  if ((this->m_FlagMask & 5) != 0) {
    pcVar1 = (this->m_Values).m_SvRconModPassword;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_rcon_mod_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 5) != 0) {
    if ((this->m_Values).m_SvRconMaxTries != 3) {
      str_format(aLineBuf,0x800,"%s %i","sv_rcon_max_tries");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001232de;
    }
    if ((this->m_Values).m_SvRconBantime != 5) {
      str_format(aLineBuf,0x800,"%s %i","sv_rcon_bantime");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001232de;
    }
    if ((this->m_Values).m_SvAutoDemoRecord != 0) {
      str_format(aLineBuf,0x800,"%s %i","sv_auto_demo_record");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001232de;
    }
    if ((this->m_Values).m_SvAutoDemoMax != 10) {
      str_format(aLineBuf,0x800,"%s %i","sv_auto_demo_max");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 5) == 0) goto LAB_001232de;
    }
    pcVar1 = (this->m_Values).m_SvMaplist;
    iVar4 = str_comp(pcVar1,"all");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","sv_maplist",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001232de:
  if ((this->m_FlagMask & 0x21) != 0) {
    pcVar1 = (this->m_Values).m_EcBindaddr;
    iVar4 = str_comp(pcVar1,"localhost");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","ec_bindaddr",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
  if ((this->m_FlagMask & 0x21) != 0) {
    if ((this->m_Values).m_EcPort != 0) {
      str_format(aLineBuf,0x800,"%s %i","ec_port");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      if ((this->m_FlagMask & 0x21) == 0) goto LAB_001233fd;
    }
    pcVar1 = (this->m_Values).m_EcPassword;
    iVar4 = str_comp(pcVar1,"");
    if (iVar4 != 0) {
      EscapeParam(aEscapeBuf,pcVar1,0x800);
      str_format(aLineBuf,0x800,"%s \"%s\"","ec_password",aEscapeBuf);
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
    }
  }
LAB_001233fd:
  uVar5 = this->m_FlagMask;
  if ((uVar5 & 0x21) != 0) {
    if ((this->m_Values).m_EcBantime != 0) {
      str_format(aLineBuf,0x800,"%s %i","ec_bantime");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 0x21) == 0) goto LAB_001234d6;
    }
    if ((this->m_Values).m_EcAuthTimeout != 0x1e) {
      str_format(aLineBuf,0x800,"%s %i","ec_auth_timeout");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
      if ((uVar5 & 0x21) == 0) goto LAB_001234d6;
    }
    if ((this->m_Values).m_EcOutputLevel != 1) {
      str_format(aLineBuf,0x800,"%s %i","ec_output_level");
      (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
      uVar5 = this->m_FlagMask;
    }
  }
LAB_001234d6:
  if (((uVar5 & 0x25) != 0) && ((this->m_Values).m_NetTcpAbortOnClose != 0)) {
    str_format(aLineBuf,0x800,"%s %i","net_tcp_abort_on_close");
    (*(this->super_IConfigManager).super_IInterface._vptr_IInterface[8])(this,aLineBuf);
  }
  ppvVar8 = &this->m_aCallbacks[0].m_pUserData;
  for (lVar6 = 0; lVar6 < this->m_NumCallbacks; lVar6 = lVar6 + 1) {
    (*((CCallback *)(ppvVar8 + -1))->m_pfnFunc)(&this->super_IConfigManager,*ppvVar8);
    ppvVar8 = ppvVar8 + 2;
  }
  io_close(this->m_ConfigFile);
  if (this->m_pConsole != (IConsole *)0x0) {
    str_format(aBuf,0x100,"saved config to \'%s\'",pcVar7);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"config",aBuf,0);
  }
LAB_00123587:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConfigManager::Save(const char *pFilename)
{
	if(!m_pStorage)
		return;

	if(!pFilename)
		pFilename = SETTINGS_FILENAME ".cfg";
	m_ConfigFile = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);

	if(!m_ConfigFile)
		return;

	WriteLine("# Teeworlds " GAME_VERSION);

	char aLineBuf[1024*2];
	char aEscapeBuf[1024*2];

	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask))&&(m_Values.m_##Name!=int(def))){ str_format(aLineBuf, sizeof(aLineBuf), "%s %i", #ScriptName, m_Values.m_##Name); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) if(((flags)&(CFGFLAG_SAVE))&&((flags)&(m_FlagMask)&&(str_comp(m_Values.m_##Name,def)))){ EscapeParam(aEscapeBuf, m_Values.m_##Name, sizeof(aEscapeBuf)); str_format(aLineBuf, sizeof(aLineBuf), "%s \"%s\"", #ScriptName, aEscapeBuf); WriteLine(aLineBuf); }

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR

	for(int i = 0; i < m_NumCallbacks; i++)
		m_aCallbacks[i].m_pfnFunc(this, m_aCallbacks[i].m_pUserData);

	io_close(m_ConfigFile);

	if(m_pConsole)
	{
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf), "saved config to '%s'", pFilename);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "config", aBuf);
	}
}